

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  type x2;
  int iVar1;
  uint uVar2;
  bool *pbVar3;
  ostream *poVar4;
  path *__s1;
  path *this;
  int iVar5;
  code *pcVar6;
  big_int32_buf_t magic;
  path replace;
  path outFilename;
  path inFilename;
  ifstream in;
  byte abStack_418 [488];
  ofstream outfile;
  
  std::filesystem::__cxx11::path::path(&inFilename);
  std::filesystem::__cxx11::path::path(&outFilename);
  this = &replace;
  std::filesystem::__cxx11::path::path(this);
  for (iVar5 = 1; iVar1 = (int)this, iVar5 < argc; iVar5 = iVar5 + 1) {
    __s1 = (path *)argv[iVar5];
    this = __s1;
    iVar1 = strcmp((char *)__s1,"-bup-parts");
    if (iVar1 == 0) {
      pbVar3 = &SAVE_BUP_AS_PARTS;
LAB_001121ea:
      *pbVar3 = true;
    }
    else {
      this = __s1;
      iVar1 = strcmp((char *)__s1,"-debug-images");
      if (iVar1 == 0) {
        iVar5 = iVar5 + 1;
        if (argc <= iVar5) goto LAB_0011245f;
        this = &debugImagePath_abi_cxx11_;
        std::filesystem::__cxx11::path::operator=(&debugImagePath_abi_cxx11_,argv + iVar5);
        pbVar3 = &SHOULD_WRITE_DEBUG_IMAGES;
        goto LAB_001121ea;
      }
      iVar1 = strcmp((char *)__s1,"-replace");
      if (iVar1 == 0) {
        iVar5 = iVar5 + 1;
        this = __s1;
        if (argc <= iVar5) goto LAB_0011245f;
        this = &replace;
        std::filesystem::__cxx11::path::operator=(this,argv + iVar5);
      }
      else {
        this = &inFilename;
        if ((inFilename._M_pathname._M_string_length != 0) &&
           (this = &outFilename, outFilename._M_pathname._M_string_length != 0)) {
LAB_0011245f:
          iVar1 = (int)this;
          usage(iVar1,argv);
          goto LAB_00112467;
        }
        std::filesystem::__cxx11::path::operator=(this,argv + iVar5);
      }
    }
  }
  if ((inFilename._M_pathname._M_string_length == 0) ||
     (outFilename._M_pathname._M_string_length == 0)) {
LAB_00112467:
    usage(iVar1,argv);
  }
  else {
    std::filesystem::__cxx11::path::operator=(&currentFileName_abi_cxx11_,&inFilename);
    std::ifstream::ifstream(&in,argv[1],_S_bin);
    if ((abStack_418[*(long *)(_in + -0x18)] & 5) == 0) {
      std::istream::read((char *)&in,(long)&magic);
      std::istream::seekg((long)&in,_S_beg);
      if (replace._M_pathname._M_string_length == 0) {
        uVar2 = (uint)magic.value_ >> 0x18 | ((uint)magic.value_ & 0xff0000) >> 8 |
                ((uint)magic.value_ & 0xff00) << 8 | (int)magic.value_ << 0x18;
        if (uVar2 == 0x54584134) {
          pcVar6 = processTxa;
        }
        else if (uVar2 == 0x4d534b33) {
          pcVar6 = processMsk3;
        }
        else if (uVar2 == 0x4d534b34) {
          pcVar6 = processMsk4;
        }
        else if (uVar2 == 0x50494334) {
          pcVar6 = processPic;
        }
        else {
          if (uVar2 != 0x42555034) {
            poVar4 = std::operator<<((ostream *)&std::cerr,argv[1]);
            poVar4 = std::operator<<(poVar4,": unknown magic: \'");
            poVar4 = std::operator<<(poVar4,magic.value_[0]);
            poVar4 = std::operator<<(poVar4,magic.value_[1]);
            poVar4 = std::operator<<(poVar4,magic.value_[2]);
            poVar4 = std::operator<<(poVar4,magic.value_[3]);
            poVar4 = std::operator<<(poVar4,"\'");
            std::endl<char,std::char_traits<char>>(poVar4);
            goto LAB_00112496;
          }
          pcVar6 = processBup;
        }
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  ((path *)&outfile,argv + 2,auto_format);
        iVar5 = (*pcVar6)(&in,&outfile);
        std::filesystem::__cxx11::path::~path((path *)&outfile);
      }
      else {
        std::ofstream::ofstream(&outfile,outFilename._M_pathname._M_dataplus._M_p,_S_bin);
        uVar2 = (uint)magic.value_ >> 0x18 | ((uint)magic.value_ & 0xff0000) >> 8 |
                ((uint)magic.value_ & 0xff00) << 8 | (int)magic.value_ << 0x18;
        if (uVar2 == 0x50494334) {
          iVar5 = replacePic((istream *)&in,(ostream *)&outfile,&replace);
        }
        else if (uVar2 == 0x54584134) {
          iVar5 = replaceTxa((istream *)&in,(ostream *)&outfile,&replace);
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,argv[1]);
          poVar4 = std::operator<<(poVar4,": file type \'");
          poVar4 = std::operator<<(poVar4,magic.value_[0]);
          poVar4 = std::operator<<(poVar4,magic.value_[1]);
          poVar4 = std::operator<<(poVar4,magic.value_[2]);
          poVar4 = std::operator<<(poVar4,magic.value_[3]);
          poVar4 = std::operator<<(poVar4,"\' unsupported by replace");
          std::endl<char,std::char_traits<char>>(poVar4);
          iVar5 = 1;
        }
        std::ofstream::~ofstream(&outfile);
      }
      std::ifstream::~ifstream(&in);
      std::filesystem::__cxx11::path::~path(&replace);
      std::filesystem::__cxx11::path::~path(&outFilename);
      std::filesystem::__cxx11::path::~path(&inFilename);
      return iVar5;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to open file ");
  poVar4 = std::operator<<(poVar4,argv[1]);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_00112496:
  exit(1);
}

Assistant:

int main(int argc, const char **argv) {
	fs::path inFilename, outFilename, replace;
#ifdef _WIN32
	int wargc;
	LPWSTR* wargv = CommandLineToArgvW(GetCommandLineW(), &wargc);
	LPWSTR* arg_fnames = wargv;
#else
	const char** arg_fnames = argv;
#endif
	for (int i = 1; i < argc; i++) {
		if (0 == strcmp(argv[i], "-bup-parts")) {
			SAVE_BUP_AS_PARTS = true;
		}
		else if (0 == strcmp(argv[i], "-debug-images")) {
			i++;
			if (i >= argc) {
				usage(argc, argv);
			}
			debugImagePath = arg_fnames[i];
			SHOULD_WRITE_DEBUG_IMAGES = true;
		}
		else if (0 == strcmp(argv[i], "-replace")) {
			i++;
			if (i >= argc) {
				usage(argc, argv);
			}
			replace = arg_fnames[i];
		}
		else if (inFilename.empty()) {
			inFilename = arg_fnames[i];
		}
		else if (outFilename.empty()) {
			outFilename = arg_fnames[i];
		}
		else {
			usage(argc, argv);
		}
	}
	if (inFilename.empty() || outFilename.empty()) {
		usage(argc,argv);
	}
	currentFileName = inFilename;

	std::ifstream in(argv[1], std::ios::binary);
	if (!in) {
		std::cerr << "Failed to open file " << argv[1] << std::endl;
		exit(EXIT_FAILURE);
	}

	boost::endian::big_int32_buf_t magic;
	
	in.read((char *)&magic, 4);
	in.seekg(0, in.beg);

	if (!replace.empty()) {
		fs::ofstream outfile(outFilename, std::ios::binary);
		switch (magic.value()) {
			case 'PIC4': return replacePic(in, outfile, replace);
			case 'TXA4': return replaceTxa(in, outfile, replace);
		}
		char *chars = (char *)&magic;
		std::cerr << argv[1] << ": file type '" << chars[0] << chars[1] << chars[2] << chars[3] << "' unsupported by replace" << std::endl;
		return EXIT_FAILURE;
	} else {
		int (*processFunction)(std::istream&, const fs::path&);
		switch (magic.value()) {
			case 'PIC4': processFunction = processPic; break;
			case 'BUP4': processFunction = processBup; break;
			case 'TXA4': processFunction = processTxa; break;
			case 'MSK3': processFunction = processMsk3; break;
			case 'MSK4': processFunction = processMsk4; break;
			default: {
				char *chars = (char *)&magic;
				std::cerr << argv[1] << ": unknown magic: '" << chars[0] << chars[1] << chars[2] << chars[3] << "'" << std::endl;
				exit(EXIT_FAILURE);
			}
		}
		return processFunction(in, argv[2]);
	}
}